

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if ((cond == 0) || (((char)(*(uint *)&window->field_0xbc >> 8) & cond) != 0)) {
    *(uint *)&window->field_0xbc = *(uint *)&window->field_0xbc & 0xfffff1ff;
    fVar1 = (window->SizeFull).x;
    fVar2 = (window->SizeFull).y;
    window->AutoFitFramesX = (size->x <= 0.0) * '\x02';
    window->AutoFitFramesY = (size->y <= 0.0) * '\x02';
    if (size->x <= 0.0) {
      window->AutoFitOnlyGrows = false;
      fVar3 = fVar1;
    }
    else {
      fVar3 = (float)(int)size->x;
      (window->SizeFull).x = fVar3;
    }
    if (size->y <= 0.0) {
      window->AutoFitOnlyGrows = false;
      fVar4 = fVar2;
    }
    else {
      fVar4 = (float)(int)size->y;
      (window->SizeFull).y = fVar4;
    }
    if (((((fVar1 != fVar3) || (NAN(fVar1) || NAN(fVar3))) || (fVar2 != fVar4)) ||
        (NAN(fVar2) || NAN(fVar4))) &&
       (((window->Flags & 0x100) == 0 && (GImGui->SettingsDirtyTimer <= 0.0)))) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    ImVec2 old_size = window->SizeFull;
    window->AutoFitFramesX = (size.x <= 0.0f) ? 2 : 0;
    window->AutoFitFramesY = (size.y <= 0.0f) ? 2 : 0;
    if (size.x <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.x = IM_FLOOR(size.x);
    if (size.y <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.y = IM_FLOOR(size.y);
    if (old_size.x != window->SizeFull.x || old_size.y != window->SizeFull.y)
        MarkIniSettingsDirty(window);
}